

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O1

void __thiscall tvm::runtime::WorkspacePool::Pool::Free(Pool *this,void *data)

{
  pointer *ppEVar1;
  undefined8 *puVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  ostream *poVar7;
  pointer pEVar8;
  pointer pEVar9;
  long lVar10;
  pointer __src;
  long lVar11;
  long lVar12;
  uint uVar13;
  Entry e;
  LogCheckError _check_err;
  Entry local_1c8;
  LogCheckError local_1b0;
  int local_1a4;
  LogMessageFatal local_1a0;
  
  pEVar9 = (this->allocated_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar9[-1].data == data) {
    pEVar8 = pEVar9 + -1;
    local_1c8.data = pEVar8->data;
    local_1c8.size = pEVar9[-1].size;
  }
  else {
    pEVar8 = (this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)((long)pEVar9 - (long)pEVar8) >> 4);
    uVar13 = iVar4 - 2;
    if (2 < iVar4) {
      do {
        if (pEVar8[uVar13].data == data) goto LAB_0010a7f2;
        bVar3 = 1 < (int)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar3);
      uVar13 = 0;
    }
LAB_0010a7f2:
    local_1a4 = 0;
    local_1a0._0_4_ = uVar13;
    dmlc::LogCheck_GT<int,int>((dmlc *)&local_1b0,(int *)&local_1a0,&local_1a4);
    if (local_1b0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"index > 0",9);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,((local_1b0.str)->_M_dataplus)._M_p,
                          (local_1b0.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"trying to free things that has not been allocated",0x31);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1b0);
    pEVar8 = (this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar9 = pEVar8 + (int)uVar13;
    __src = pEVar9 + 1;
    local_1c8.data = pEVar9->data;
    local_1c8.size = pEVar9->size;
    pEVar9 = (this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__src != pEVar9) {
      memmove(pEVar8 + (int)uVar13,__src,(long)pEVar9 - (long)__src);
    }
    pEVar8 = (this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar8;
  __position._M_current =
       (this->free_list_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current[-1].size < local_1c8.size) {
    if (__position._M_current ==
        (this->free_list_).
        super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
      ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
                ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                  *)this,__position,&local_1c8);
    }
    else {
      (__position._M_current)->data = local_1c8.data;
      (__position._M_current)->size = local_1c8.size;
      ppEVar1 = &(this->free_list_).
                 super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
  }
  else {
    lVar12 = (long)__position._M_current -
             (long)(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar12 == 0x20) {
      if (__position._M_current ==
          (this->free_list_).
          super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
        ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
                  ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                    *)this,__position,__position._M_current + -1);
      }
      else {
        sVar5 = __position._M_current[-1].size;
        (__position._M_current)->data = __position._M_current[-1].data;
        (__position._M_current)->size = sVar5;
        ppEVar1 = &(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      pEVar9 = (this->free_list_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar9[1].data = local_1c8.data;
      pEVar9[1].size = local_1c8.size;
    }
    else {
      lVar12 = lVar12 >> 4;
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::resize(&this->free_list_,lVar12 + 1);
      lVar10 = lVar12 + -1;
      pEVar9 = (this->free_list_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_1c8.size < pEVar9[lVar10].size) {
        pEVar8 = pEVar9 + lVar10;
        lVar11 = lVar12 << 4;
        do {
          sVar5 = pEVar8->size;
          puVar2 = (undefined8 *)((long)&pEVar9->data + lVar11);
          *puVar2 = pEVar8->data;
          puVar2[1] = sVar5;
          lVar10 = lVar10 + -1;
          pEVar9 = (this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar8 = pEVar9 + lVar10;
          lVar12 = lVar12 + -1;
          lVar6 = lVar11 + -0x18;
          lVar11 = lVar11 + -0x10;
        } while (local_1c8.size < *(ulong *)((long)pEVar9 + lVar6));
      }
      pEVar9[lVar12].data = local_1c8.data;
      pEVar9[lVar12].size = local_1c8.size;
    }
  }
  return;
}

Assistant:

void Free(void *data) {
    Entry e;
    if (allocated_.back().data == data) {
      // quick path, last allocated.
      e = allocated_.back();
      allocated_.pop_back();
    } else {
      int index = static_cast<int>(allocated_.size()) - 2;
      for (; index > 0 && allocated_[index].data != data; --index) {
      }
      CHECK_GT(index, 0) << "trying to free things that has not been allocated";
      e = allocated_[index];
      allocated_.erase(allocated_.begin() + index);
    }
    if (free_list_.back().size < e.size) {
      free_list_.push_back(e);
    } else if (free_list_.size() == 2) {
      free_list_.push_back(free_list_.back());
      free_list_[1] = e;
    } else {
      size_t i = free_list_.size() - 1;
      free_list_.resize(free_list_.size() + 1);
      for (; e.size < free_list_[i].size; --i) {
        free_list_[i + 1] = free_list_[i];
      }
      free_list_[i + 1] = e;
    }
  }